

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

CEPlanet * CEPlanet::Saturn(void)

{
  CEPlanet *in_RDI;
  allocator local_69;
  CEAngle local_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Saturn",&local_69);
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&local_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&local_68,&local_44);
  CEAngle::~CEAngle(&local_68);
  CEAngle::~CEAngle(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_69);
  SetSemiMajorAxis_AU(in_RDI,9.54149883,-3.065e-05);
  SetEccentricity(in_RDI,0.05550825,-0.00032044);
  SetInclination(in_RDI,2.49424102,0.00451969,DEGREES);
  SetMeanLongitude(in_RDI,50.07571329,1222.11494724,DEGREES);
  SetPerihelionLongitude(in_RDI,92.86136063,0.54179478,DEGREES);
  SetAscendingNodeLongitude(in_RDI,113.63998702,-0.25015002,DEGREES);
  SetExtraTerms(in_RDI,0.00025899,-0.13434469,0.87320147,38.35125);
  SetMeanRadius_m(in_RDI,58232000.0);
  SetAlbedo(in_RDI,0.47);
  SetMass_kg(in_RDI,5.68319e+26);
  local_40._M_dataplus._M_p = (pointer)0x4018000000000000;
  SetSofaID(in_RDI,(double *)&local_40);
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::Saturn()
{
    CEPlanet saturn("Saturn", 0.0, 0.0) ;
    saturn.SetSemiMajorAxis_AU(9.54149883, -0.00003065) ;
    saturn.SetEccentricity(0.05550825, -0.00032044) ;
    saturn.SetInclination(2.49424102, 0.00451969, CEAngleType::DEGREES) ;
    saturn.SetMeanLongitude(50.07571329, 1222.11494724, CEAngleType::DEGREES) ;
    saturn.SetPerihelionLongitude(92.86136063, 0.54179478, CEAngleType::DEGREES) ;
    saturn.SetAscendingNodeLongitude(113.63998702, -0.25015002, CEAngleType::DEGREES) ;
    
    saturn.SetExtraTerms(0.00025899, -0.13434469, 0.87320147, 38.35125000) ;
    
    // Set planetary properties
    saturn.SetMeanRadius_m(58232000.0) ;
    saturn.SetAlbedo(0.47) ;
    saturn.SetMass_kg(5.68319E26) ;
    
    // Set the sofa planet ID
    saturn.SetSofaID(6) ;
    
    return saturn ;
}